

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult fill_out_count_pointer_pair<VkPhysicalDevice_T*>
                   (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *data_vec,
                   uint32_t *pCount,VkPhysicalDevice_T **pData)

{
  uint uVar1;
  VkResult VVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (pCount != (uint32_t *)0x0) {
    uVar4 = (long)(data_vec->
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(data_vec->
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (pData == (VkPhysicalDevice_T **)0x0) {
      VVar2 = VK_SUCCESS;
      uVar3 = uVar4 >> 3 & 0xffffffff;
    }
    else {
      uVar4 = (long)uVar4 >> 3;
      uVar1 = *pCount;
      uVar3 = (ulong)uVar1;
      if (uVar4 <= uVar1) {
        uVar3 = uVar4 & 0xffffffff;
      }
      if ((int)uVar3 != 0) {
        uVar4 = 0;
        do {
          pData[uVar4] = (data_vec->
                         super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        uVar4 = (long)(data_vec->
                      super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(data_vec->
                      super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3;
      }
      VVar2 = (uint)(uVar1 < uVar4) * 5;
    }
    *pCount = (uint32_t)uVar3;
    return VVar2;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}